

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# infback.c
# Opt level: O3

int inflateBack(z_streamp strm,in_func in,void *in_desc,out_func out,void *out_desc)

{
  byte bVar1;
  byte bVar2;
  z_streamp pzVar3;
  internal_state *piVar4;
  long *plVar5;
  byte bVar6;
  undefined4 uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  byte *pbVar13;
  long lVar14;
  Posf *pPVar15;
  ulong uVar16;
  undefined2 uVar17;
  ushort *puVar18;
  char *pcVar19;
  uchar uVar20;
  uint uVar21;
  ulong uVar22;
  ulg uVar23;
  Posf *pPVar24;
  ulong uVar25;
  uint uVar26;
  internal_state *piVar27;
  ushort uVar28;
  ulong uVar29;
  out_func p_Var30;
  int iVar31;
  uchar *__dest;
  bool bVar32;
  uchar *next;
  byte *local_b8;
  z_streamp local_b0;
  uint local_a4;
  out_func local_a0;
  internal_state *local_98;
  in_func local_90;
  void *local_88;
  ulong local_80;
  long *local_78;
  void *local_70;
  ct_data_s *local_68;
  uInt *local_60;
  uint local_54;
  Posf **local_50;
  ct_data_s *local_48;
  uint *local_40;
  uchar *local_38;
  
  if ((strm == (z_streamp)0x0) || (local_98 = strm->state, local_98 == (internal_state *)0x0)) {
    return -2;
  }
  strm->msg = (char *)0x0;
  *(undefined8 *)&local_98->status = 0x3f3f;
  *(undefined4 *)&local_98->gzindex = 0;
  local_b8 = strm->next_in;
  uVar8 = 0;
  if (local_b8 != (byte *)0x0) {
    uVar8 = strm->avail_in;
  }
  __dest = *(uchar **)&local_98->method;
  local_a4 = *(uint *)((long)&local_98->gzhead + 4);
  local_78 = &local_98->block_start;
  local_48 = local_98->dyn_ltree + 0x121;
  local_60 = &local_98->hash_shift;
  local_50 = &local_98->head;
  local_68 = local_98->dyn_ltree + 0x91;
  local_40 = (uint *)((long)&local_98->head + 4);
  iVar11 = 0x3f3f;
  uVar25 = 0;
  uVar29 = 0;
  local_b0 = strm;
  local_a0 = out;
  local_90 = in;
  local_88 = in_desc;
  local_70 = out_desc;
  do {
    piVar27 = local_98;
    uVar9 = (uint)uVar29;
    iVar31 = -2;
    bVar32 = false;
    bVar6 = (byte)uVar29;
    switch(iVar11) {
    case 0x3f3f:
      if (*(int *)&local_98->field_0xc == 0) {
        if (uVar9 < 3) {
          if ((uVar8 == 0) && (uVar8 = (*local_90)(local_88,&local_b8), uVar8 == 0)) {
LAB_00174928:
            local_b8 = (byte *)0x0;
            uVar8 = 0;
LAB_00174939:
            iVar31 = -5;
            goto switchD_00173bfe_caseD_3f40;
          }
          uVar9 = uVar9 | 8;
          uVar8 = uVar8 - 1;
          uVar25 = uVar25 + ((ulong)*local_b8 << (bVar6 & 0x3f));
          local_b8 = local_b8 + 1;
        }
        *(uint *)&piVar27->field_0xc = (uint)uVar25 & 1;
        switch((uint)(uVar25 >> 1) & 3) {
        case 0:
          iVar11 = 0x3f41;
          break;
        case 1:
          piVar27->window_size = (ulg)fixedtables_lenfix;
          piVar27->head = (Posf *)0x500000009;
          piVar27->prev = (Posf *)fixedtables_distfix;
          iVar11 = 0x3f48;
          break;
        case 2:
          iVar11 = 0x3f44;
          break;
        case 3:
          local_b0->msg = "invalid block type";
          iVar11 = 0x3f51;
        }
        piVar27->status = iVar11;
        uVar25 = uVar25 >> 3;
        uVar29 = (ulong)(uVar9 - 3);
      }
      else {
        uVar25 = uVar25 >> (bVar6 & 7);
        uVar29 = (ulong)(uVar9 & 0xfffffff8);
        local_98->status = 0x3f50;
      }
      break;
    case 0x3f40:
    case 0x3f42:
    case 0x3f43:
    case 0x3f45:
    case 0x3f46:
    case 0x3f47:
switchD_00173bfe_caseD_3f40:
      bVar32 = false;
      p_Var30 = local_a0;
LAB_00174945:
      pzVar3 = local_b0;
      uVar9 = *(uint *)((long)&local_98->gzhead + 4);
      uVar21 = uVar9 - local_a4;
      if (local_a4 <= uVar9 && uVar21 != 0) {
        iVar12 = (*p_Var30)(local_70,*(uchar **)&local_98->method,uVar21);
        iVar11 = -5;
        if (iVar12 == 0) {
          iVar11 = iVar31;
        }
        if (bVar32) {
          iVar31 = iVar11;
        }
      }
      pzVar3->next_in = local_b8;
      pzVar3->avail_in = uVar8;
      return iVar31;
    case 0x3f41:
      uVar25 = uVar25 >> (bVar6 & 7);
      if (uVar9 < 0x20) {
        uVar22 = (ulong)(uVar9 & 0x18);
        do {
          if ((uVar8 == 0) && (uVar8 = (*local_90)(local_88,&local_b8), uVar8 == 0))
          goto LAB_00174928;
          uVar8 = uVar8 - 1;
          pbVar13 = local_b8 + 1;
          uVar25 = uVar25 + ((ulong)*local_b8 << ((byte)uVar22 & 0x3f));
          uVar29 = uVar22 + 8;
          bVar32 = uVar22 < 0x18;
          uVar22 = uVar29;
          local_b8 = pbVar13;
        } while (bVar32);
        uVar29 = uVar29 & 0xffffffff;
      }
      else {
        uVar29 = (ulong)(uVar9 & 0xfffffff8);
      }
      piVar27 = local_98;
      p_Var30 = local_a0;
      if ((uVar25 >> 0x10 ^ uVar25 & 0xffff) != 0xffff) {
        pcVar19 = "invalid stored block lengths";
        goto LAB_00174046;
      }
      uVar21 = (uint)uVar25 & 0xffff;
      *(uint *)&local_98->field_0x5c = uVar21;
      uVar9 = local_a4;
      if ((uVar25 & 0xffff) != 0) {
        do {
          if ((uVar8 == 0) && (uVar8 = (*local_90)(local_88,&local_b8), uVar8 == 0)) {
            local_b8 = (byte *)0x0;
            uVar8 = 0;
LAB_001749d6:
            local_a4 = uVar9;
            iVar31 = -5;
            bVar32 = false;
            goto LAB_00174945;
          }
          if (uVar9 == 0) {
            __dest = *(uchar **)&piVar27->method;
            uVar9 = *(uint *)((long)&piVar27->gzhead + 4);
            *(uint *)&piVar27->gzindex = uVar9;
            iVar11 = (*p_Var30)(local_70,__dest,uVar9);
            if (iVar11 != 0) goto LAB_001749d6;
          }
          if (uVar8 <= uVar21) {
            uVar21 = uVar8;
          }
          if (uVar9 <= uVar21) {
            uVar21 = uVar9;
          }
          uVar29 = (ulong)uVar21;
          memcpy(__dest,local_b8,uVar29);
          local_b8 = local_b8 + uVar29;
          uVar8 = uVar8 - uVar21;
          uVar9 = uVar9 - uVar21;
          __dest = __dest + uVar29;
          uVar21 = *(int *)&piVar27->field_0x5c - uVar21;
          *(uint *)&piVar27->field_0x5c = uVar21;
        } while (uVar21 != 0);
      }
      piVar27->status = 0x3f3f;
      uVar25 = 0;
      uVar29 = 0;
      local_a4 = uVar9;
      break;
    case 0x3f44:
      uVar22 = uVar29;
      if (uVar9 < 0xe) {
        do {
          if ((uVar8 == 0) && (uVar8 = (*local_90)(local_88,&local_b8), uVar8 == 0))
          goto LAB_00174928;
          uVar8 = uVar8 - 1;
          pbVar13 = local_b8 + 1;
          uVar25 = uVar25 + ((ulong)*local_b8 << ((byte)uVar22 & 0x3f));
          uVar29 = uVar22 + 8;
          bVar32 = uVar22 < 6;
          uVar22 = uVar29;
          local_b8 = pbVar13;
        } while (bVar32);
      }
      plVar5 = local_78;
      uVar21 = (uint)uVar25 & 0x1f;
      piVar27->hash_size = uVar21 + 0x101;
      uVar10 = (uint)(uVar25 >> 5) & 0x1f;
      piVar27->hash_bits = uVar10 + 1;
      uVar9 = ((uint)(uVar25 >> 10) & 0xf) + 4;
      piVar27->ins_h = uVar9;
      uVar25 = uVar25 >> 0xe;
      uVar29 = (ulong)((int)uVar29 - 0xe);
      if (uVar21 < 0x1e && uVar10 < 0x1e) {
        piVar27->hash_mask = 0;
        uVar22 = 0;
        do {
          uVar21 = (uint)uVar29;
          if (uVar21 < 3) {
            if (uVar8 == 0) {
              uVar8 = (*local_90)(local_88,&local_b8);
              if (uVar8 == 0) goto LAB_00174928;
              uVar9 = piVar27->ins_h;
              uVar22 = (ulong)piVar27->hash_mask;
            }
            uVar21 = uVar21 | 8;
            uVar8 = uVar8 - 1;
            uVar25 = uVar25 + ((ulong)*local_b8 << ((byte)uVar29 & 0x3f));
            local_b8 = local_b8 + 1;
          }
          uVar10 = (int)uVar22 + 1;
          piVar27->hash_mask = uVar10;
          *(ushort *)((long)(piVar27->dyn_ltree + -0xf) + (ulong)inflateBack::order[uVar22] * 2) =
               (ushort)uVar25 & 7;
          uVar25 = uVar25 >> 3;
          uVar29 = (ulong)(uVar21 - 3);
          uVar22 = (ulong)uVar10;
        } while (uVar10 < uVar9);
        if (uVar10 < 0x13) {
          uVar22 = (ulong)uVar10;
          puVar18 = inflateBack::order + uVar22;
          do {
            uVar22 = uVar22 + 1;
            *(undefined2 *)((long)plVar5 + (ulong)*puVar18 * 2) = 0;
            puVar18 = puVar18 + 1;
          } while ((int)uVar22 != 0x13);
          piVar27->hash_mask = 0x13;
        }
        *(ct_data_s **)&piVar27->hash_shift = local_48;
        piVar27->window_size = (ulg)local_48;
        *(undefined4 *)&piVar27->head = 7;
        iVar11 = inflate_table(CODES,(unsigned_short *)plVar5,0x13,(code **)local_60,
                               (uint *)local_50,(unsigned_short *)local_68);
        if (iVar11 == 0) {
          piVar27->hash_mask = 0;
          uVar9 = piVar27->hash_size;
          if (piVar27->hash_bits + uVar9 != 0) {
            do {
              uVar23 = piVar27->window_size;
              uVar7 = *(undefined4 *)&piVar27->head;
              uVar22 = (ulong)(~(-1 << ((byte)uVar7 & 0x1f)) & (uint)uVar25);
              bVar6 = *(byte *)(uVar23 + 1 + uVar22 * 4);
              if ((uint)uVar29 < (uint)bVar6) {
                do {
                  if (uVar8 == 0) {
                    uVar8 = (*local_90)(local_88,&local_b8);
                    if (uVar8 == 0) goto LAB_00174928;
                    uVar23 = piVar27->window_size;
                    uVar7 = *(undefined4 *)&piVar27->head;
                  }
                  pbVar13 = local_b8 + 1;
                  uVar8 = uVar8 - 1;
                  uVar25 = uVar25 + ((ulong)*local_b8 << ((byte)uVar29 & 0x3f));
                  uVar29 = uVar29 + 8;
                  uVar22 = (ulong)(~(-1 << ((byte)uVar7 & 0x1f)) & (uint)uVar25);
                  bVar6 = *(byte *)(uVar23 + 1 + uVar22 * 4);
                  local_b8 = pbVar13;
                } while (uVar29 < bVar6);
                lVar14 = uVar23 + uVar22 * 4;
              }
              else {
                lVar14 = uVar23 + uVar22 * 4;
              }
              uVar21 = (uint)bVar6;
              uVar28 = *(ushort *)(lVar14 + 2);
              uVar9 = (uint)uVar29;
              if (0xf < uVar28) {
                if (uVar28 == 0x10) {
                  if (uVar9 < uVar21 + 2) {
                    local_80 = CONCAT71(local_80._1_7_,bVar6);
                    uVar29 = uVar29 & 0xffffffff;
                    do {
                      if ((uVar8 == 0) && (uVar8 = (*local_90)(local_88,&local_b8), uVar8 == 0))
                      goto LAB_00174928;
                      pbVar13 = local_b8 + 1;
                      uVar8 = uVar8 - 1;
                      uVar25 = uVar25 + ((ulong)*local_b8 << ((byte)uVar29 & 0x3f));
                      uVar29 = uVar29 + 8;
                      local_b8 = pbVar13;
                    } while (uVar29 < uVar21 + 2);
                    bVar6 = (byte)local_80;
                    piVar27 = local_98;
                  }
                  uVar25 = uVar25 >> (bVar6 & 0x3f);
                  uVar21 = (int)uVar29 - uVar21;
                  uVar29 = (ulong)uVar21;
                  if (piVar27->hash_mask != 0) {
                    uVar17 = *(undefined2 *)((long)local_78 + (ulong)(piVar27->hash_mask - 1) * 2);
                    iVar11 = ((uint)uVar25 & 3) + 3;
                    uVar25 = uVar25 >> 2;
                    uVar21 = uVar21 - 2;
                    goto LAB_001745e6;
                  }
                }
                else {
                  if (uVar28 == 0x11) {
                    if (uVar9 < uVar21 + 3) {
                      local_80 = CONCAT71(local_80._1_7_,bVar6);
                      uVar29 = uVar29 & 0xffffffff;
                      do {
                        if ((uVar8 == 0) && (uVar8 = (*local_90)(local_88,&local_b8), uVar8 == 0))
                        goto LAB_00174928;
                        pbVar13 = local_b8 + 1;
                        uVar8 = uVar8 - 1;
                        uVar25 = uVar25 + ((ulong)*local_b8 << ((byte)uVar29 & 0x3f));
                        uVar29 = uVar29 + 8;
                        local_b8 = pbVar13;
                      } while (uVar29 < uVar21 + 3);
                      bVar6 = (byte)local_80;
                      piVar27 = local_98;
                    }
                    uVar25 = uVar25 >> (bVar6 & 0x3f);
                    iVar11 = ((uint)uVar25 & 7) + 3;
                    uVar25 = uVar25 >> 3;
                    uVar21 = ((int)uVar29 - uVar21) - 3;
                  }
                  else {
                    if (uVar9 < uVar21 + 7) {
                      local_80 = CONCAT71(local_80._1_7_,bVar6);
                      uVar29 = uVar29 & 0xffffffff;
                      do {
                        if ((uVar8 == 0) && (uVar8 = (*local_90)(local_88,&local_b8), uVar8 == 0))
                        goto LAB_00174928;
                        pbVar13 = local_b8 + 1;
                        uVar8 = uVar8 - 1;
                        uVar25 = uVar25 + ((ulong)*local_b8 << ((byte)uVar29 & 0x3f));
                        uVar29 = uVar29 + 8;
                        local_b8 = pbVar13;
                      } while (uVar29 < uVar21 + 7);
                      bVar6 = (byte)local_80;
                      piVar27 = local_98;
                    }
                    uVar25 = uVar25 >> (bVar6 & 0x3f);
                    iVar11 = ((uint)uVar25 & 0x7f) + 0xb;
                    uVar25 = uVar25 >> 7;
                    uVar21 = ((int)uVar29 - uVar21) - 7;
                  }
                  uVar17 = 0;
LAB_001745e6:
                  uVar29 = (ulong)uVar21;
                  uVar9 = piVar27->hash_size;
                  uVar21 = piVar27->hash_mask;
                  uVar10 = piVar27->hash_bits + uVar9;
                  if (uVar21 + iVar11 <= uVar10) {
                    do {
                      uVar22 = (ulong)uVar21;
                      uVar21 = uVar21 + 1;
                      *(undefined2 *)((long)local_78 + uVar22 * 2) = uVar17;
                      iVar11 = iVar11 + -1;
                    } while (iVar11 != 0);
                    piVar27->hash_mask = uVar21;
                    goto LAB_0017461b;
                  }
                }
                pcVar19 = "invalid bit length repeat";
                goto LAB_00174046;
              }
              uVar25 = uVar25 >> (bVar6 & 0x3f);
              uVar29 = (ulong)(uVar9 - uVar21);
              uVar9 = piVar27->hash_mask;
              uVar21 = uVar9 + 1;
              piVar27->hash_mask = uVar21;
              *(ushort *)((long)(piVar27->dyn_ltree + -0xf) + (ulong)uVar9 * 2) = uVar28;
              uVar9 = piVar27->hash_size;
              uVar10 = piVar27->hash_bits + uVar9;
LAB_0017461b:
            } while (uVar21 < uVar10);
          }
          plVar5 = local_78;
          if (piVar27->status == 0x3f51) break;
          if (piVar27->dyn_ltree[0x71].fc.freq == 0) {
            pcVar19 = "invalid code -- missing end-of-block";
          }
          else {
            *(ct_data_s **)&piVar27->hash_shift = local_48;
            piVar27->window_size = (ulg)local_48;
            *(undefined4 *)&piVar27->head = 9;
            iVar11 = inflate_table(LENS,(unsigned_short *)local_78,uVar9,(code **)local_60,
                                   (uint *)local_50,(unsigned_short *)local_68);
            if (iVar11 == 0) {
              piVar27->prev = *(Posf **)&piVar27->hash_shift;
              *(undefined4 *)((long)&piVar27->head + 4) = 6;
              iVar11 = inflate_table(DISTS,(unsigned_short *)
                                           ((long)plVar5 + (ulong)piVar27->hash_size * 2),
                                     piVar27->hash_bits,(code **)local_60,local_40,
                                     (unsigned_short *)local_68);
              if (iVar11 == 0) {
                piVar27->status = 0x3f48;
                goto LAB_00173ceb;
              }
              pcVar19 = "invalid distances set";
            }
            else {
              pcVar19 = "invalid literal/lengths set";
            }
          }
        }
        else {
          pcVar19 = "invalid code lengths set";
        }
      }
      else {
        pcVar19 = "too many length or distance symbols";
      }
LAB_00174046:
      local_b0->msg = pcVar19;
      piVar27->status = 0x3f51;
      break;
    case 0x3f48:
LAB_00173ceb:
      piVar4 = local_98;
      pzVar3 = local_b0;
      if ((uVar8 < 6) || (local_a4 < 0x102)) {
        uVar23 = piVar27->window_size;
        uVar7 = *(undefined4 *)&piVar27->head;
        uVar22 = (ulong)(~(-1 << ((byte)uVar7 & 0x1f)) & (uint)uVar25);
        bVar6 = *(byte *)(uVar23 + 1 + uVar22 * 4);
        uVar16 = (ulong)bVar6;
        if ((uint)uVar29 < (uint)bVar6) {
          do {
            if (uVar8 == 0) {
              uVar8 = (*local_90)(local_88,&local_b8);
              if (uVar8 == 0) goto LAB_00174928;
              uVar23 = piVar4->window_size;
              uVar7 = *(undefined4 *)&piVar4->head;
            }
            pbVar13 = local_b8 + 1;
            uVar8 = uVar8 - 1;
            uVar25 = uVar25 + ((ulong)*local_b8 << ((byte)uVar29 & 0x3f));
            uVar29 = uVar29 + 8;
            uVar22 = (ulong)(~(-1 << ((byte)uVar7 & 0x1f)) & (uint)uVar25);
            uVar16 = (ulong)*(byte *)(uVar23 + 1 + uVar22 * 4);
            local_b8 = pbVar13;
          } while (uVar29 < uVar16);
          pbVar13 = (byte *)(uVar23 + uVar22 * 4);
        }
        else {
          pbVar13 = (byte *)(uVar23 + uVar22 * 4);
        }
        uVar21 = (uint)uVar16;
        uVar9 = (uint)uVar29;
        uVar28 = *(ushort *)(pbVar13 + 2);
        bVar6 = *pbVar13;
        if ((byte)(bVar6 - 1) < 0xf) {
          bVar2 = (byte)uVar16;
          uVar10 = (uint)uVar28;
          uVar26 = ~(-1 << (bVar6 + bVar2 & 0x1f));
          uVar22 = (ulong)((((uint)uVar25 & uVar26) >> (bVar2 & 0x1f)) + (uint)uVar28);
          bVar1 = *(byte *)(uVar23 + 1 + uVar22 * 4);
          if (uVar9 < uVar21 + bVar1) {
            uVar29 = uVar29 & 0xffffffff;
            local_80 = CONCAT44(local_80._4_4_,(uint)uVar28);
            local_38 = __dest;
            do {
              if (uVar8 == 0) {
                uVar8 = (*local_90)(local_88,&local_b8);
                if (uVar8 == 0) goto LAB_00174928;
                uVar23 = local_98->window_size;
                __dest = local_38;
                uVar10 = (uint)local_80;
              }
              uVar8 = uVar8 - 1;
              pbVar13 = local_b8 + 1;
              uVar25 = uVar25 + ((ulong)*local_b8 << ((byte)uVar29 & 0x3f));
              uVar29 = uVar29 + 8;
              uVar22 = (ulong)((((uint)uVar25 & uVar26) >> (bVar2 & 0x1f)) + uVar10);
              bVar1 = *(byte *)(uVar23 + 1 + uVar22 * 4);
              local_b8 = pbVar13;
            } while (uVar29 < uVar21 + bVar1);
          }
          pbVar13 = (byte *)(uVar23 + uVar22 * 4);
          uVar25 = uVar25 >> (bVar2 & 0x3f);
          uVar28 = *(ushort *)(pbVar13 + 2);
          bVar6 = *pbVar13;
          uVar9 = (int)uVar29 - uVar21;
          uVar21 = (uint)bVar1;
        }
        piVar27 = local_98;
        uVar25 = uVar25 >> ((byte)uVar21 & 0x3f);
        uVar9 = uVar9 - uVar21;
        uVar29 = (ulong)uVar9;
        uVar20 = (uchar)uVar28;
        uVar21 = (uint)uVar28;
        *(uint *)&local_98->field_0x5c = (uint)uVar28;
        if (bVar6 == 0) {
          uVar9 = local_a4;
          if (local_a4 == 0) {
            __dest = *(uchar **)&local_98->method;
            uVar9 = *(uint *)((long)&local_98->gzhead + 4);
            *(uint *)&local_98->gzindex = uVar9;
            iVar11 = (*local_a0)(local_70,__dest,uVar9);
            local_a4 = uVar9;
            if (iVar11 != 0) goto LAB_00174939;
            uVar20 = (uchar)*(undefined4 *)&piVar27->field_0x5c;
          }
          *__dest = uVar20;
          __dest = __dest + 1;
          piVar27->status = 0x3f48;
          local_a4 = uVar9 - 1;
        }
        else {
          if ((bVar6 & 0x20) == 0) {
            if ((bVar6 & 0x40) == 0) {
              uVar10 = bVar6 & 0xf;
              *(uint *)((long)&local_98->window + 4) = uVar10;
              if ((bVar6 & 0xf) != 0) {
                if (uVar9 < uVar10) {
                  do {
                    if (uVar8 == 0) {
                      uVar8 = (*local_90)(local_88,&local_b8);
                      if (uVar8 == 0) goto LAB_00174928;
                      uVar10 = *(uint *)((long)&piVar27->window + 4);
                    }
                    pbVar13 = local_b8 + 1;
                    uVar8 = uVar8 - 1;
                    uVar25 = uVar25 + ((ulong)*local_b8 << ((byte)uVar29 & 0x3f));
                    uVar9 = (int)uVar29 + 8;
                    uVar29 = (ulong)uVar9;
                    local_b8 = pbVar13;
                  } while (uVar9 < uVar10);
                  uVar21 = *(uint *)&piVar27->field_0x5c;
                }
                *(uint *)&piVar27->field_0x5c =
                     (~(-1 << ((byte)uVar10 & 0x1f)) & (uint)uVar25) + uVar21;
                uVar25 = uVar25 >> ((byte)uVar10 & 0x3f);
                uVar29 = (ulong)(uVar9 - uVar10);
              }
              piVar4 = local_98;
              pPVar24 = piVar27->prev;
              uVar7 = *(undefined4 *)((long)&piVar27->head + 4);
              uVar16 = (ulong)(~(-1 << ((byte)uVar7 & 0x1f)) & (uint)uVar25);
              bVar6 = *(byte *)((long)pPVar24 + uVar16 * 4 + 1);
              uVar22 = (ulong)bVar6;
              if ((uint)uVar29 < (uint)bVar6) {
                do {
                  if (uVar8 == 0) {
                    uVar8 = (*local_90)(local_88,&local_b8);
                    if (uVar8 == 0) goto LAB_00174928;
                    pPVar24 = piVar4->prev;
                    uVar7 = *(undefined4 *)((long)&piVar4->head + 4);
                  }
                  pbVar13 = local_b8 + 1;
                  uVar8 = uVar8 - 1;
                  uVar25 = uVar25 + ((ulong)*local_b8 << ((byte)uVar29 & 0x3f));
                  uVar29 = uVar29 + 8;
                  uVar16 = (ulong)(~(-1 << ((byte)uVar7 & 0x1f)) & (uint)uVar25);
                  uVar22 = (ulong)*(byte *)((long)pPVar24 + uVar16 * 4 + 1);
                  local_b8 = pbVar13;
                } while (uVar29 < uVar22);
                pPVar15 = pPVar24 + uVar16 * 2;
              }
              else {
                pPVar15 = pPVar24 + uVar16 * 2;
              }
              uVar9 = (uint)uVar29;
              uVar28 = pPVar15[1];
              bVar6 = (byte)*pPVar15;
              if (bVar6 < 0x10) {
                bVar2 = (byte)uVar22;
                uVar21 = (uint)uVar28;
                uVar10 = ~(-1 << (bVar6 + bVar2 & 0x1f));
                uVar16 = (ulong)((((uint)uVar25 & uVar10) >> (bVar2 & 0x1f)) + (uint)uVar28);
                bVar1 = *(byte *)((long)pPVar24 + uVar16 * 4 + 1);
                if (uVar9 < (int)uVar22 + (uint)bVar1) {
                  uVar29 = uVar29 & 0xffffffff;
                  local_80 = uVar22;
                  local_54 = (uint)uVar28;
                  do {
                    if (uVar8 == 0) {
                      uVar8 = (*local_90)(local_88,&local_b8);
                      if (uVar8 == 0) goto LAB_00174928;
                      pPVar24 = local_98->prev;
                      uVar22 = local_80;
                      uVar21 = local_54;
                    }
                    uVar8 = uVar8 - 1;
                    pbVar13 = local_b8 + 1;
                    uVar25 = uVar25 + ((ulong)*local_b8 << ((byte)uVar29 & 0x3f));
                    uVar29 = uVar29 + 8;
                    uVar16 = (ulong)((((uint)uVar25 & uVar10) >> ((byte)uVar22 & 0x1f)) + uVar21);
                    bVar1 = *(byte *)((long)pPVar24 + uVar16 * 4 + 1);
                    local_b8 = pbVar13;
                  } while (uVar29 < (int)uVar22 + (uint)bVar1);
                }
                uVar25 = uVar25 >> (bVar2 & 0x3f);
                uVar28 = (pPVar24 + uVar16 * 2)[1];
                bVar6 = (byte)pPVar24[uVar16 * 2];
                uVar9 = (int)uVar29 - (int)uVar22;
                uVar22 = (ulong)bVar1;
              }
              piVar27 = local_98;
              uVar21 = local_a4;
              uVar25 = uVar25 >> ((byte)uVar22 & 0x3f);
              uVar9 = uVar9 - (int)uVar22;
              uVar29 = (ulong)uVar9;
              if ((bVar6 & 0x40) == 0) {
                uVar26 = (uint)uVar28;
                *(uint *)&local_98->window = (uint)uVar28;
                uVar10 = bVar6 & 0xf;
                *(uint *)((long)&local_98->window + 4) = uVar10;
                if ((bVar6 & 0xf) != 0) {
                  if (uVar9 < uVar10) {
                    do {
                      if (uVar8 == 0) {
                        uVar8 = (*local_90)(local_88,&local_b8);
                        if (uVar8 == 0) goto LAB_00174928;
                        uVar10 = *(uint *)((long)&piVar27->window + 4);
                      }
                      pbVar13 = local_b8 + 1;
                      uVar8 = uVar8 - 1;
                      uVar25 = uVar25 + ((ulong)*local_b8 << ((byte)uVar29 & 0x3f));
                      uVar9 = (int)uVar29 + 8;
                      uVar29 = (ulong)uVar9;
                      local_b8 = pbVar13;
                    } while (uVar9 < uVar10);
                    uVar26 = *(uint *)&piVar27->window;
                  }
                  uVar26 = uVar26 + (~(-1 << ((byte)uVar10 & 0x1f)) & (uint)uVar25);
                  *(uint *)&piVar27->window = uVar26;
                  uVar25 = uVar25 >> ((byte)uVar10 & 0x3f);
                  uVar29 = (ulong)(uVar9 - uVar10);
                }
                uVar9 = *(uint *)((long)&piVar27->gzhead + 4);
                uVar10 = 0;
                if ((uint)piVar27->gzindex < uVar9) {
                  uVar10 = uVar21;
                }
                if (uVar26 <= uVar9 - uVar10) {
                  do {
                    uVar9 = *(uint *)((long)&piVar27->gzhead + 4);
                    if (uVar21 == 0) {
                      __dest = *(uchar **)&piVar27->method;
                      *(uint *)&piVar27->gzindex = uVar9;
                      local_a4 = uVar9;
                      iVar11 = (*local_a0)(local_70,__dest);
                      if (iVar11 != 0) goto LAB_00174939;
                      uVar9 = *(uint *)((long)&piVar27->gzhead + 4);
                      uVar21 = local_a4;
                    }
                    uVar9 = uVar9 - *(uint *)&piVar27->window;
                    uVar22 = (ulong)uVar9;
                    bVar32 = uVar21 <= uVar9;
                    if (bVar32) {
                      uVar9 = 0;
                    }
                    uVar10 = *(uint *)&piVar27->field_0x5c;
                    if (bVar32) {
                      uVar22 = -(ulong)*(uint *)&piVar27->window;
                    }
                    uVar26 = uVar21 - uVar9;
                    if (uVar10 <= uVar21 - uVar9) {
                      uVar26 = uVar10;
                    }
                    *(uint *)&piVar27->field_0x5c = uVar10 - uVar26;
                    uVar9 = uVar26;
                    do {
                      *__dest = __dest[uVar22];
                      __dest = __dest + 1;
                      uVar9 = uVar9 - 1;
                    } while (uVar9 != 0);
                    uVar21 = uVar21 - uVar26;
                    local_a4 = uVar21;
                  } while (*(int *)&piVar27->field_0x5c != 0);
                  break;
                }
                pcVar19 = "invalid distance too far back";
              }
              else {
                pcVar19 = "invalid distance code";
              }
            }
            else {
              pcVar19 = "invalid literal/length code";
            }
            goto LAB_00174046;
          }
          local_98->status = 0x3f3f;
        }
      }
      else {
        local_b0->next_out = __dest;
        local_b0->avail_out = local_a4;
        local_b0->next_in = local_b8;
        local_b0->avail_in = uVar8;
        piVar27->w_size = (int)uVar25;
        piVar27->w_bits = (int)(uVar25 >> 0x20);
        piVar27->w_mask = (uint)uVar29;
        uVar8 = *(uint *)((long)&piVar27->gzhead + 4);
        if ((uint)piVar27->gzindex < uVar8) {
          *(uint *)&piVar27->gzindex = uVar8 - local_a4;
        }
        inflate_fast(local_b0,uVar8);
        local_b8 = pzVar3->next_in;
        __dest = pzVar3->next_out;
        uVar8 = pzVar3->avail_in;
        uVar25._0_4_ = piVar27->w_size;
        uVar25._4_4_ = piVar27->w_bits;
        uVar29 = (ulong)piVar27->w_mask;
        local_a4 = pzVar3->avail_out;
      }
      break;
    default:
      p_Var30 = local_a0;
      if (iVar11 == 0x3f50) {
        iVar31 = 1;
        bVar32 = true;
      }
      else if (iVar11 == 0x3f51) {
        iVar31 = -3;
        bVar32 = false;
      }
      goto LAB_00174945;
    }
    iVar11 = piVar27->status;
  } while( true );
}

Assistant:

int ZEXPORT inflateBack(z_streamp strm, in_func in, void FAR *in_desc,
                        out_func out, void FAR *out_desc) {
    struct inflate_state FAR *state;
    z_const unsigned char FAR *next;    /* next input */
    unsigned char FAR *put;     /* next output */
    unsigned have, left;        /* available input and output */
    unsigned long hold;         /* bit buffer */
    unsigned bits;              /* bits in bit buffer */
    unsigned copy;              /* number of stored or match bytes to copy */
    unsigned char FAR *from;    /* where to copy match bytes from */
    code here;                  /* current decoding table entry */
    code last;                  /* parent table entry */
    unsigned len;               /* length to copy for repeats, bits to drop */
    int ret;                    /* return code */
    static const unsigned short order[19] = /* permutation of code lengths */
        {16, 17, 18, 0, 8, 7, 9, 6, 10, 5, 11, 4, 12, 3, 13, 2, 14, 1, 15};

    /* Check that the strm exists and that the state was initialized */
    if (strm == Z_NULL || strm->state == Z_NULL)
        return Z_STREAM_ERROR;
    state = (struct inflate_state FAR *)strm->state;

    /* Reset the state */
    strm->msg = Z_NULL;
    state->mode = TYPE;
    state->last = 0;
    state->whave = 0;
    next = strm->next_in;
    have = next != Z_NULL ? strm->avail_in : 0;
    hold = 0;
    bits = 0;
    put = state->window;
    left = state->wsize;

    /* Inflate until end of block marked as last */
    for (;;)
        switch (state->mode) {
        case TYPE:
            /* determine and dispatch block type */
            if (state->last) {
                BYTEBITS();
                state->mode = DONE;
                break;
            }
            NEEDBITS(3);
            state->last = BITS(1);
            DROPBITS(1);
            switch (BITS(2)) {
            case 0:                             /* stored block */
                Tracev((stderr, "inflate:     stored block%s\n",
                        state->last ? " (last)" : ""));
                state->mode = STORED;
                break;
            case 1:                             /* fixed block */
                fixedtables(state);
                Tracev((stderr, "inflate:     fixed codes block%s\n",
                        state->last ? " (last)" : ""));
                state->mode = LEN;              /* decode codes */
                break;
            case 2:                             /* dynamic block */
                Tracev((stderr, "inflate:     dynamic codes block%s\n",
                        state->last ? " (last)" : ""));
                state->mode = TABLE;
                break;
            case 3:
                strm->msg = (char *)"invalid block type";
                state->mode = BAD;
            }
            DROPBITS(2);
            break;

        case STORED:
            /* get and verify stored block length */
            BYTEBITS();                         /* go to byte boundary */
            NEEDBITS(32);
            if ((hold & 0xffff) != ((hold >> 16) ^ 0xffff)) {
                strm->msg = (char *)"invalid stored block lengths";
                state->mode = BAD;
                break;
            }
            state->length = (unsigned)hold & 0xffff;
            Tracev((stderr, "inflate:       stored length %u\n",
                    state->length));
            INITBITS();

            /* copy stored block from input to output */
            while (state->length != 0) {
                copy = state->length;
                PULL();
                ROOM();
                if (copy > have) copy = have;
                if (copy > left) copy = left;
                zmemcpy(put, next, copy);
                have -= copy;
                next += copy;
                left -= copy;
                put += copy;
                state->length -= copy;
            }
            Tracev((stderr, "inflate:       stored end\n"));
            state->mode = TYPE;
            break;

        case TABLE:
            /* get dynamic table entries descriptor */
            NEEDBITS(14);
            state->nlen = BITS(5) + 257;
            DROPBITS(5);
            state->ndist = BITS(5) + 1;
            DROPBITS(5);
            state->ncode = BITS(4) + 4;
            DROPBITS(4);
#ifndef PKZIP_BUG_WORKAROUND
            if (state->nlen > 286 || state->ndist > 30) {
                strm->msg = (char *)"too many length or distance symbols";
                state->mode = BAD;
                break;
            }
#endif
            Tracev((stderr, "inflate:       table sizes ok\n"));

            /* get code length code lengths (not a typo) */
            state->have = 0;
            while (state->have < state->ncode) {
                NEEDBITS(3);
                state->lens[order[state->have++]] = (unsigned short)BITS(3);
                DROPBITS(3);
            }
            while (state->have < 19)
                state->lens[order[state->have++]] = 0;
            state->next = state->codes;
            state->lencode = (code const FAR *)(state->next);
            state->lenbits = 7;
            ret = inflate_table(CODES, state->lens, 19, &(state->next),
                                &(state->lenbits), state->work);
            if (ret) {
                strm->msg = (char *)"invalid code lengths set";
                state->mode = BAD;
                break;
            }
            Tracev((stderr, "inflate:       code lengths ok\n"));

            /* get length and distance code code lengths */
            state->have = 0;
            while (state->have < state->nlen + state->ndist) {
                for (;;) {
                    here = state->lencode[BITS(state->lenbits)];
                    if ((unsigned)(here.bits) <= bits) break;
                    PULLBYTE();
                }
                if (here.val < 16) {
                    DROPBITS(here.bits);
                    state->lens[state->have++] = here.val;
                }
                else {
                    if (here.val == 16) {
                        NEEDBITS(here.bits + 2);
                        DROPBITS(here.bits);
                        if (state->have == 0) {
                            strm->msg = (char *)"invalid bit length repeat";
                            state->mode = BAD;
                            break;
                        }
                        len = (unsigned)(state->lens[state->have - 1]);
                        copy = 3 + BITS(2);
                        DROPBITS(2);
                    }
                    else if (here.val == 17) {
                        NEEDBITS(here.bits + 3);
                        DROPBITS(here.bits);
                        len = 0;
                        copy = 3 + BITS(3);
                        DROPBITS(3);
                    }
                    else {
                        NEEDBITS(here.bits + 7);
                        DROPBITS(here.bits);
                        len = 0;
                        copy = 11 + BITS(7);
                        DROPBITS(7);
                    }
                    if (state->have + copy > state->nlen + state->ndist) {
                        strm->msg = (char *)"invalid bit length repeat";
                        state->mode = BAD;
                        break;
                    }
                    while (copy--)
                        state->lens[state->have++] = (unsigned short)len;
                }
            }

            /* handle error breaks in while */
            if (state->mode == BAD) break;

            /* check for end-of-block code (better have one) */
            if (state->lens[256] == 0) {
                strm->msg = (char *)"invalid code -- missing end-of-block";
                state->mode = BAD;
                break;
            }

            /* build code tables -- note: do not change the lenbits or distbits
               values here (9 and 6) without reading the comments in inftrees.h
               concerning the ENOUGH constants, which depend on those values */
            state->next = state->codes;
            state->lencode = (code const FAR *)(state->next);
            state->lenbits = 9;
            ret = inflate_table(LENS, state->lens, state->nlen, &(state->next),
                                &(state->lenbits), state->work);
            if (ret) {
                strm->msg = (char *)"invalid literal/lengths set";
                state->mode = BAD;
                break;
            }
            state->distcode = (code const FAR *)(state->next);
            state->distbits = 6;
            ret = inflate_table(DISTS, state->lens + state->nlen, state->ndist,
                            &(state->next), &(state->distbits), state->work);
            if (ret) {
                strm->msg = (char *)"invalid distances set";
                state->mode = BAD;
                break;
            }
            Tracev((stderr, "inflate:       codes ok\n"));
            state->mode = LEN;
                /* fallthrough */

        case LEN:
            /* use inflate_fast() if we have enough input and output */
            if (have >= 6 && left >= 258) {
                RESTORE();
                if (state->whave < state->wsize)
                    state->whave = state->wsize - left;
                inflate_fast(strm, state->wsize);
                LOAD();
                break;
            }

            /* get a literal, length, or end-of-block code */
            for (;;) {
                here = state->lencode[BITS(state->lenbits)];
                if ((unsigned)(here.bits) <= bits) break;
                PULLBYTE();
            }
            if (here.op && (here.op & 0xf0) == 0) {
                last = here;
                for (;;) {
                    here = state->lencode[last.val +
                            (BITS(last.bits + last.op) >> last.bits)];
                    if ((unsigned)(last.bits + here.bits) <= bits) break;
                    PULLBYTE();
                }
                DROPBITS(last.bits);
            }
            DROPBITS(here.bits);
            state->length = (unsigned)here.val;

            /* process literal */
            if (here.op == 0) {
                Tracevv((stderr, here.val >= 0x20 && here.val < 0x7f ?
                        "inflate:         literal '%c'\n" :
                        "inflate:         literal 0x%02x\n", here.val));
                ROOM();
                *put++ = (unsigned char)(state->length);
                left--;
                state->mode = LEN;
                break;
            }

            /* process end of block */
            if (here.op & 32) {
                Tracevv((stderr, "inflate:         end of block\n"));
                state->mode = TYPE;
                break;
            }

            /* invalid code */
            if (here.op & 64) {
                strm->msg = (char *)"invalid literal/length code";
                state->mode = BAD;
                break;
            }

            /* length code -- get extra bits, if any */
            state->extra = (unsigned)(here.op) & 15;
            if (state->extra != 0) {
                NEEDBITS(state->extra);
                state->length += BITS(state->extra);
                DROPBITS(state->extra);
            }
            Tracevv((stderr, "inflate:         length %u\n", state->length));

            /* get distance code */
            for (;;) {
                here = state->distcode[BITS(state->distbits)];
                if ((unsigned)(here.bits) <= bits) break;
                PULLBYTE();
            }
            if ((here.op & 0xf0) == 0) {
                last = here;
                for (;;) {
                    here = state->distcode[last.val +
                            (BITS(last.bits + last.op) >> last.bits)];
                    if ((unsigned)(last.bits + here.bits) <= bits) break;
                    PULLBYTE();
                }
                DROPBITS(last.bits);
            }
            DROPBITS(here.bits);
            if (here.op & 64) {
                strm->msg = (char *)"invalid distance code";
                state->mode = BAD;
                break;
            }
            state->offset = (unsigned)here.val;

            /* get distance extra bits, if any */
            state->extra = (unsigned)(here.op) & 15;
            if (state->extra != 0) {
                NEEDBITS(state->extra);
                state->offset += BITS(state->extra);
                DROPBITS(state->extra);
            }
            if (state->offset > state->wsize - (state->whave < state->wsize ?
                                                left : 0)) {
                strm->msg = (char *)"invalid distance too far back";
                state->mode = BAD;
                break;
            }
            Tracevv((stderr, "inflate:         distance %u\n", state->offset));

            /* copy match from window to output */
            do {
                ROOM();
                copy = state->wsize - state->offset;
                if (copy < left) {
                    from = put + copy;
                    copy = left - copy;
                }
                else {
                    from = put - state->offset;
                    copy = left;
                }
                if (copy > state->length) copy = state->length;
                state->length -= copy;
                left -= copy;
                do {
                    *put++ = *from++;
                } while (--copy);
            } while (state->length != 0);
            break;

        case DONE:
            /* inflate stream terminated properly */
            ret = Z_STREAM_END;
            goto inf_leave;

        case BAD:
            ret = Z_DATA_ERROR;
            goto inf_leave;

        default:
            /* can't happen, but makes compilers happy */
            ret = Z_STREAM_ERROR;
            goto inf_leave;
        }

    /* Write leftover output and return unused input */
  inf_leave:
    if (left < state->wsize) {
        if (out(out_desc, state->window, state->wsize - left) &&
            ret == Z_STREAM_END)
            ret = Z_BUF_ERROR;
    }
    strm->next_in = next;
    strm->avail_in = have;
    return ret;
}